

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

string * __thiscall
cmGeneratorTarget::CreateFortranModuleDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *working_dir)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t __n;
  cmMakefile *this_00;
  bool bVar2;
  int iVar3;
  cmValue cVar4;
  string *psVar5;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string target_mod_dir;
  string local_d0;
  string local_b0;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  string local_80;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_b0.field_2;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Fortran_MODULE_DIRECTORY","")
  ;
  cVar4 = GetProperty(this,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (cVar4.Value != (string *)0x0) {
    std::__cxx11::string::_M_assign((string *)&local_d0);
    goto LAB_004be8ac;
  }
  psVar5 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator);
  __n = psVar5->_M_string_length;
  if (__n == working_dir->_M_string_length) {
    if (__n == 0) goto LAB_004be8ac;
    iVar3 = bcmp((psVar5->_M_dataplus)._M_p,(working_dir->_M_dataplus)._M_p,__n);
    if (iVar3 == 0) goto LAB_004be8ac;
  }
  std::__cxx11::string::_M_assign((string *)&local_d0);
LAB_004be8ac:
  this_00 = this->Makefile;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"CMAKE_Fortran_MODDIR_FLAG","");
  cVar4 = cmMakefile::GetDefinition(this_00,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((local_d0._M_string_length != 0) && (cVar4.Value != (string *)0x0)) {
    bVar2 = cmsys::SystemTools::FileIsFullPath(&local_d0);
    if (bVar2) {
      std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    }
    else {
      psVar5 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator);
      local_b0._M_string_length = (size_type)(psVar5->_M_dataplus)._M_p;
      local_b0._M_dataplus._M_p = (pointer)psVar5->_M_string_length;
      local_b0.field_2._8_8_ = local_50;
      local_60 = 1;
      local_50[0] = 0x2f;
      local_b0.field_2._M_allocated_capacity = 1;
      local_90 = local_d0._M_string_length;
      local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_d0._M_dataplus._M_p;
      views._M_len = 3;
      views._M_array = (iterator)&local_b0;
      local_58 = (undefined1 *)local_b0.field_2._8_8_;
      cmCatViews_abi_cxx11_(&local_80,views);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    }
    cmsys::SystemTools::MakeDirectory(__return_storage_ptr__,(mode_t *)0x0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,
                    CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                             local_d0.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::CreateFortranModuleDirectory(
  std::string const& working_dir) const
{
  std::string mod_dir;
  std::string target_mod_dir;
  if (cmValue prop = this->GetProperty("Fortran_MODULE_DIRECTORY")) {
    target_mod_dir = *prop;
  } else {
    std::string const& default_mod_dir =
      this->LocalGenerator->GetCurrentBinaryDirectory();
    if (default_mod_dir != working_dir) {
      target_mod_dir = default_mod_dir;
    }
  }
  cmValue moddir_flag =
    this->Makefile->GetDefinition("CMAKE_Fortran_MODDIR_FLAG");
  if (!target_mod_dir.empty() && moddir_flag) {
    // Compute the full path to the module directory.
    if (cmSystemTools::FileIsFullPath(target_mod_dir)) {
      // Already a full path.
      mod_dir = target_mod_dir;
    } else {
      // Interpret relative to the current output directory.
      mod_dir = cmStrCat(this->LocalGenerator->GetCurrentBinaryDirectory(),
                         '/', target_mod_dir);
    }

    // Make sure the module output directory exists.
    cmSystemTools::MakeDirectory(mod_dir);
  }
  return mod_dir;
}